

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_rxreplaceinput.cpp
# Opt level: O2

void * __thiscall RXReplaceInput::qt_metacast(RXReplaceInput *this,char *_clname)

{
  int iVar1;
  void *pvVar2;
  
  if (_clname == (char *)0x0) {
    this = (RXReplaceInput *)0x0;
  }
  else {
    iVar1 = strcmp(_clname,qt_meta_stringdata_RXReplaceInput.stringdata0);
    if (iVar1 != 0) {
      iVar1 = strcmp(_clname,"RXBaseInput");
      if (iVar1 != 0) {
        pvVar2 = (void *)QWidget::qt_metacast((char *)this);
        return pvVar2;
      }
      this = (RXReplaceInput *)&this->super_RXBaseInput;
    }
  }
  return this;
}

Assistant:

void *RXReplaceInput::qt_metacast(const char *_clname)
{
    if (!_clname) return nullptr;
    if (!strcmp(_clname, qt_meta_stringdata_RXReplaceInput.stringdata0))
        return static_cast<void*>(this);
    if (!strcmp(_clname, "RXBaseInput"))
        return static_cast< RXBaseInput*>(this);
    return QWidget::qt_metacast(_clname);
}